

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O3

int ARKodeGetStepDirection(void *arkode_mem,sunrealtype *stepdir)

{
  double dVar1;
  
  if (arkode_mem == (void *)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x934,"ARKodeGetStepDirection",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_io.c"
                    ,"arkode_mem = NULL illegal.");
    return -0x15;
  }
  if (stepdir == (sunrealtype *)0x0) {
    arkProcessError((ARKodeMem)arkode_mem,-0x16,0x93c,"ARKodeGetStepDirection",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_io.c"
                    ,"stepdir cannot be NULL");
  }
  if (*(int *)((long)arkode_mem + 0x300) == 0) {
    dVar1 = *(double *)((long)arkode_mem + 0x2c0);
    if ((dVar1 != 0.0) || (NAN(dVar1))) goto LAB_0013ecf5;
  }
  dVar1 = *(double *)((long)arkode_mem + 0x2b8);
LAB_0013ecf5:
  *stepdir = dVar1;
  return 0;
}

Assistant:

int ARKodeGetStepDirection(void* arkode_mem, sunrealtype* stepdir)
{
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  if (stepdir == NULL)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "stepdir cannot be NULL");
  }

  *stepdir = (ark_mem->fixedstep || ark_mem->h == ZERO) ? ark_mem->hin
                                                        : ark_mem->h;
  return (ARK_SUCCESS);
}